

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcBlendEquationAdvancedTests.cpp
# Opt level: O0

IterateResult __thiscall glcts::MissingQualifierTestGroup::MissingCase::iterate(MissingCase *this)

{
  GLfloat GVar1;
  GLfloat GVar2;
  GLfloat GVar3;
  glClearColorFunc p_Var4;
  glcts *this_00;
  glUseProgramFunc p_Var5;
  glUniform4fFunc p_Var6;
  glGetUniformLocationFunc p_Var7;
  bool bVar8;
  int iVar9;
  deUint32 dVar10;
  GLenum GVar11;
  GLint GVar12;
  RenderContext *pRVar13;
  undefined4 extraout_var;
  TestLog *log_00;
  float *pfVar14;
  char *pcVar15;
  TestError *this_01;
  GLSLVersion glslVersion;
  char *extensionDirective;
  char *local_478;
  undefined1 local_338 [3];
  bool pass;
  GLenum error;
  allocator<char> local_319;
  string local_318;
  undefined1 local_2f8 [8];
  VertexArrayBinding posBinding;
  string local_2a0;
  string local_280;
  allocator<char> local_259;
  string local_258;
  string local_238;
  ProgramSources local_218;
  undefined1 local_148 [8];
  ShaderProgram p;
  Vec4 srcCol;
  undefined1 local_58 [8];
  Vec4 dstCol;
  FBOSentry fbo;
  TestLog *log;
  Functions *gl;
  int dim;
  MissingCase *this_local;
  Functions *gl_00;
  
  pRVar13 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar9 = (*pRVar13->_vptr_RenderContext[3])();
  gl_00 = (Functions *)CONCAT44(extraout_var,iVar9);
  log_00 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  bVar8 = IsExtensionSupported((this->super_TestCase).m_context,"GL_KHR_blend_equation_advanced");
  if (bVar8) {
    extensionDirective = (char *)0x8058;
    FBOSentry::FBOSentry((FBOSentry *)(dstCol.m_data + 2),gl_00,4,4,0x8058);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_58,1.0,1.0,1.0,1.0);
    tcu::Vector<float,_4>::Vector
              ((Vector<float,_4> *)((long)&p.m_program.m_info.linkTimeUs + 4),0.0,0.0,0.0,1.0);
    p_Var4 = gl_00->clearColor;
    pfVar14 = tcu::Vector<float,_4>::x((Vector<float,_4> *)local_58);
    GVar1 = *pfVar14;
    pfVar14 = tcu::Vector<float,_4>::y((Vector<float,_4> *)local_58);
    GVar2 = *pfVar14;
    pfVar14 = tcu::Vector<float,_4>::z((Vector<float,_4> *)local_58);
    GVar3 = *pfVar14;
    pfVar14 = tcu::Vector<float,_4>::w((Vector<float,_4> *)local_58);
    (*p_Var4)(GVar1,GVar2,GVar3,*pfVar14);
    (*gl_00->clear)(0x4000);
    pRVar13 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
    GetDef2DVtxSrc_abi_cxx11_(&local_258,(glcts *)(ulong)this->m_glslVersion,glslVersion);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_238,pcVar15,&local_259);
    this_00 = (glcts *)this->m_layoutQualifier;
    pcVar15 = glu::getGLSLVersionDeclaration(this->m_glslVersion);
    GetSolidShader_abi_cxx11_
              (&local_2a0,this_00,pcVar15,"#extension GL_KHR_blend_equation_advanced : require",
               extensionDirective);
    pcVar15 = (char *)std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_280,pcVar15,(allocator<char> *)((long)&posBinding.pointer.data + 7))
    ;
    glu::makeVtxFragSources(&local_218,&local_238,&local_280);
    glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_148,pRVar13,&local_218);
    glu::ProgramSources::~ProgramSources(&local_218);
    std::__cxx11::string::~string((string *)&local_280);
    std::allocator<char>::~allocator((allocator<char> *)((long)&posBinding.pointer.data + 7));
    std::__cxx11::string::~string((string *)&local_2a0);
    std::__cxx11::string::~string((string *)&local_238);
    std::allocator<char>::~allocator(&local_259);
    std::__cxx11::string::~string((string *)&local_258);
    bVar8 = glu::ShaderProgram::isOk((ShaderProgram *)local_148);
    if (!bVar8) {
      glu::operator<<(log_00,(ShaderProgram *)local_148);
      this_01 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_01,"Compile failed",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                 ,0x4f7);
      __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    p_Var5 = gl_00->useProgram;
    dVar10 = glu::ShaderProgram::getProgram((ShaderProgram *)local_148);
    (*p_Var5)(dVar10);
    GVar11 = (*gl_00->getError)();
    glu::checkError(GVar11,"Program failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                    ,0x4fb);
    (*gl_00->disable)(0xbd0);
    (*gl_00->enable)(0xbe2);
    (*gl_00->blendEquation)(this->m_mode);
    GVar11 = (*gl_00->getError)();
    glu::checkError(GVar11,"BlendEquation failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                    ,0x501);
    p_Var6 = gl_00->uniform4f;
    p_Var7 = gl_00->getUniformLocation;
    dVar10 = glu::ShaderProgram::getProgram((ShaderProgram *)local_148);
    GVar12 = (*p_Var7)(dVar10,"uSrcCol");
    pfVar14 = tcu::Vector<float,_4>::x
                        ((Vector<float,_4> *)((long)&p.m_program.m_info.linkTimeUs + 4));
    GVar1 = *pfVar14;
    pfVar14 = tcu::Vector<float,_4>::y
                        ((Vector<float,_4> *)((long)&p.m_program.m_info.linkTimeUs + 4));
    GVar2 = *pfVar14;
    pfVar14 = tcu::Vector<float,_4>::z
                        ((Vector<float,_4> *)((long)&p.m_program.m_info.linkTimeUs + 4));
    GVar3 = *pfVar14;
    pfVar14 = tcu::Vector<float,_4>::w
                        ((Vector<float,_4> *)((long)&p.m_program.m_info.linkTimeUs + 4));
    (*p_Var6)(GVar12,GVar1,GVar2,GVar3,*pfVar14);
    GVar11 = (*gl_00->getError)();
    glu::checkError(GVar11,"Uniform failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                    ,0x505);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_318,"aPos",&local_319);
    glu::va::Float((VertexArrayBinding *)local_2f8,&local_318,2,4,0,(float *)s_pos);
    std::__cxx11::string::~string((string *)&local_318);
    std::allocator<char>::~allocator(&local_319);
    GVar11 = (*gl_00->getError)();
    glu::checkError(GVar11,"Attributes failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcBlendEquationAdvancedTests.cpp"
                    ,0x508);
    pRVar13 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
    dVar10 = glu::ShaderProgram::getProgram((ShaderProgram *)local_148);
    glu::pr::Triangles((PrimitiveList *)local_338,6,(deUint16 *)s_indices);
    glu::draw(pRVar13,dVar10,1,(VertexArrayBinding *)local_2f8,(PrimitiveList *)local_338,
              (DrawUtilCallback *)0x0);
    GVar11 = (*gl_00->getError)();
    if (GVar11 != 0x502) {
      local_478 = "Fail";
    }
    else {
      local_478 = "Pass";
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               (uint)(GVar11 != 0x502),local_478);
    glu::VertexArrayBinding::~VertexArrayBinding((VertexArrayBinding *)local_2f8);
    glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_148);
    FBOSentry::~FBOSentry((FBOSentry *)(dstCol.m_data + 2));
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_NOT_SUPPORTED,"GL_KHR_blend_equation_advanced");
  }
  return STOP;
}

Assistant:

MissingQualifierTestGroup::MissingCase::IterateResult MissingQualifierTestGroup::MissingCase::iterate(void)
{
	const int			  dim = 4;
	const glw::Functions& gl  = m_context.getRenderContext().getFunctions();
	TestLog&			  log = m_testCtx.getLog();

	// Check that extension is supported.
	if (!IsExtensionSupported(m_context, "GL_KHR_blend_equation_advanced"))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "GL_KHR_blend_equation_advanced");
		return STOP;
	}

	FBOSentry fbo(gl, dim, dim, GL_RGBA8);

	tcu::Vec4 dstCol(1.f, 1.f, 1.f, 1.f);
	tcu::Vec4 srcCol(0.f, 0.f, 0.f, 1.f);

	// Clear to destination color.
	gl.clearColor(dstCol.x(), dstCol.y(), dstCol.z(), dstCol.w());
	gl.clear(GL_COLOR_BUFFER_BIT);

	// Setup program.
	glu::ShaderProgram p(m_context.getRenderContext(),
						 glu::makeVtxFragSources(
							 GetDef2DVtxSrc(m_glslVersion).c_str(),
							 GetSolidShader(m_layoutQualifier, glu::getGLSLVersionDeclaration(m_glslVersion)).c_str()));
	if (!p.isOk())
	{
		log << p;
		TCU_FAIL("Compile failed");
	}

	gl.useProgram(p.getProgram());
	GLU_EXPECT_NO_ERROR(gl.getError(), "Program failed");

	// Enable blending and set blend equation.
	gl.disable(GL_DITHER);
	gl.enable(GL_BLEND);
	gl.blendEquation(m_mode);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BlendEquation failed");

	// Setup source color.
	gl.uniform4f(gl.getUniformLocation(p.getProgram(), "uSrcCol"), srcCol.x(), srcCol.y(), srcCol.z(), srcCol.w());
	GLU_EXPECT_NO_ERROR(gl.getError(), "Uniform failed");

	glu::VertexArrayBinding posBinding = glu::va::Float("aPos", 2, 4, 0, &s_pos[0]);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Attributes failed");

	glu::draw(m_context.getRenderContext(), p.getProgram(), 1, &posBinding,
			  glu::pr::Triangles(DE_LENGTH_OF_ARRAY(s_indices), &s_indices[0]));

	glw::GLenum error = gl.getError();
	bool		pass  = (error == GL_INVALID_OPERATION);

	m_testCtx.setTestResult(pass ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL, pass ? "Pass" : "Fail");

	return STOP;
}